

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
polyscope::render::backend_openGL_mock::GLAttributeBuffer::getDataRange_helper<int>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,GLAttributeBuffer *this,
          size_t start,size_t count)

{
  allocator_type local_41;
  string local_40;
  
  if (((this->super_AttributeBuffer).setFlag != true) ||
     ((ulong)((long)(this->super_AttributeBuffer).arrayCount *
             (this->super_AttributeBuffer).dataSize) < start + count)) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"bad getData","");
    exception(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,count,&local_41);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> GLAttributeBuffer::getDataRange_helper(size_t start, size_t count) {
  if (!isSet() || start + count > static_cast<size_t>(getDataSize() * getArrayCount())) exception("bad getData");
  bind();
  std::vector<T> readValues(count);
  return readValues;
}